

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

void filter_run(filter *f,float in,float *out)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  iVar1 = f->pointer;
  f->pointer = iVar1 + 1;
  f->buffer[iVar1] = in;
  iVar2 = f->length;
  lVar4 = (long)iVar2;
  if (lVar4 < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    lVar3 = 0;
    do {
      fVar5 = fVar5 + *(float *)((long)f + lVar3 * 4 + lVar4 * -4 + (long)iVar1 * 4 + 0x10) *
                      f->taps[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  *out = fVar5;
  if (iVar1 + 1 == 0x400) {
    memcpy(f->buffer,&f->pointer + -lVar4,lVar4 * 4);
    f->pointer = iVar2;
  }
  return;
}

Assistant:

void filter_run(struct filter *f, float in, float *out)
{
	float *ptr = f->buffer + f->pointer++;

	*ptr = in;
	
	// TODO: optimize: pass filter length as constant to enable
	// using optimized __mac_c and fix the number of rounds there!
	#ifndef	__HAVE_ARCH_MAC
	*out = filter_mac(ptr - f->length, f->taps, f->length);
	#else
	*out = mac(ptr - f->length, f->taps, f->length);
	#endif
	//*out = filter_mac(ptr - f->length, f->taps, 53);

	if (f->pointer == BufferLen) {
		memcpy(f->buffer, 
		       f->buffer + BufferLen - f->length,
		       f->length * sizeof(float));
		f->pointer = f->length;
	}
}